

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

double util::rpn_eval(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *stack,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                             *vars)

{
  value_type vVar1;
  double __n;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  reference __x;
  char *pcVar5;
  runtime_error *this;
  reference pvVar6;
  pointer pvVar7;
  reference pvVar8;
  double local_100;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
  local_f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
  local_f0;
  const_iterator findvar;
  vector<double,_std::allocator<double>_> local_e0;
  value_type local_c8;
  double local_c0;
  size_t ii;
  undefined1 local_b0 [8];
  vector<double,_std::allocator<double>_> args;
  rpn_eval_func *func;
  size_t i;
  string *val;
  stack<double,_std::deque<double,_std::allocator<double>_>_> argstack;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *vars_local;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *stack_local;
  
  if ((rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
       ::rpn_eval_funcs == '\0') &&
     (iVar4 = __cxa_guard_acquire(&rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
                                   ::rpn_eval_funcs), iVar4 != 0)) {
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs,'+',"add",2,rpn_eval_add);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 1,'-',"sub",2,rpn_eval_sub);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 2,'*',"mul",2,rpn_eval_mul);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 3,'/',"div",2,rpn_eval_div);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 4,'%',"mod",2,rpn_eval_mod);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 5,'&',"bitand",2,rpn_eval_bitand);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 6,'|',"bitor",2,rpn_eval_bitor);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 7,'^',"bitxor",2,rpn_eval_bitxor);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 8,'~',"bitnot",1,rpn_eval_bitnot);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 9,'\x05',"and",2,rpn_eval_and)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 10,'\x06',"or",2,rpn_eval_or);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0xb,'!',"not",1,rpn_eval_not);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0xc,'\a',"neg",1,rpn_eval_neg)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0xd,' ',"pow",2,rpn_eval_pow);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0xe,' ',"sqrt",1,rpn_eval_sqrt);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0xf,' ',"log",1,rpn_eval_log);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x10,' ',"exp",1,rpn_eval_exp)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x11,' ',"ln",1,rpn_eval_ln);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x12,' ',"sin",1,rpn_eval_sin)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x13,' ',"cos",1,rpn_eval_cos)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x14,' ',"tan",1,rpn_eval_tan)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x15,' ',"rand",2,rpn_eval_rand);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x16,' ',"min",2,rpn_eval_min)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x17,' ',"max",2,rpn_eval_max)
    ;
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x18,' ',"ceil",1,rpn_eval_ceil);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x19,' ',"round",1,rpn_eval_round);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x1a,' ',"floor",1,rpn_eval_floor);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x1b,'<',"lt",2,rpn_eval_lt);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x1c,'\x03',"lte",2,rpn_eval_lte);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x1d,'=',"eq",2,rpn_eval_eq);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x1e,'\x02',"ne",2,rpn_eval_ne);
    rpn_eval::rpn_eval_func::rpn_eval_func
              (rpn_eval::rpn_eval_funcs + 0x1f,'\x04',"gte",2,rpn_eval_gte);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x20,'>',"gt",2,rpn_eval_gt);
    rpn_eval::rpn_eval_func::rpn_eval_func(rpn_eval::rpn_eval_funcs + 0x21,'?',"iif",3,rpn_eval_iif)
    ;
    __cxa_guard_release(&rpn_eval(std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::unordered_map<std::__cxx11::string,double,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>const&)
                         ::rpn_eval_funcs);
  }
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>
            ((stack<double,std::deque<double,std::allocator<double>>> *)&val);
LAB_0022983d:
  bVar3 = std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(stack);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    bVar3 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::empty
                      ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
    if (bVar3) {
      stack_local = (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x0;
      findvar.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
      ._M_cur._4_4_ = 1;
    }
    else {
      pvVar8 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                         ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
      stack_local = (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)*pvVar8;
      findvar.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
      ._M_cur._4_4_ = 1;
    }
  }
  else {
    do {
      __x = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::top(stack);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop(stack);
      func = (rpn_eval_func *)0x0;
      while( true ) {
        if ((rpn_eval_func *)0x21 < func) {
          local_f0._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::find(vars,__x);
          local_f8._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::end(vars);
          bVar3 = std::__detail::operator!=(&local_f0,&local_f8);
          if (bVar3) {
            pvVar7 = std::__detail::
                     _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>
                     ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_false,_true>
                                   *)&local_f0);
            std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                      ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val,
                       &pvVar7->second);
          }
          else {
            local_100 = tdparse(__x);
            std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                      ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val,
                       &local_100);
          }
          goto LAB_0022983d;
        }
        args.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)(rpn_eval::rpn_eval_funcs + (long)func);
        bVar3 = std::operator==(__x,rpn_eval::rpn_eval_funcs[(long)func].name);
        if ((bVar3) ||
           ((*(char *)args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != ' ' &&
            (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__x),
            *pcVar5 ==
            *(char *)args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)))) break;
        func = (rpn_eval_func *)&func->field_0x1;
      }
      __n = args.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage[2];
      std::allocator<double>::allocator((allocator<double> *)((long)&ii + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_b0,(size_type)__n,
                 (allocator<double> *)((long)&ii + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&ii + 7));
      for (local_c0 = 0.0;
          (ulong)local_c0 <
          (ulong)args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[2];
          local_c0 = (double)((long)local_c0 + 1)) {
        bVar3 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::empty
                          ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
        if (bVar3) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"RPN Stack underflow");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar8 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                           ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
        vVar1 = *pvVar8;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_b0,(size_type)local_c0)
        ;
        *pvVar6 = vVar1;
        std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
                  ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
      }
      pcVar2 = (code *)args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[3];
      std::vector<double,_std::allocator<double>_>::vector
                (&local_e0,(vector<double,_std::allocator<double>_> *)local_b0);
      local_c8 = (value_type)(*pcVar2)(&local_e0);
      std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
                ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val,&local_c8);
      std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
      bVar3 = std::
              stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(stack);
      if (bVar3) {
        pvVar8 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                           ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
        stack_local = (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)*pvVar8;
        findvar.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
        ._M_cur._4_4_ = 1;
      }
      else {
        findvar.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
        ._M_cur._4_4_ = 4;
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_b0);
    } while (findvar.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
             ._M_cur._4_4_ == 4);
  }
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::~stack
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)&val);
  return (double)stack_local;
}

Assistant:

double rpn_eval(std::stack<std::string> stack, const std::unordered_map<std::string, double>& vars)
{
	struct rpn_eval_func
	{
		char op;
		const char *name;
		std::size_t args;
		double (*func)(std::vector<double>);

		rpn_eval_func(char op_, const char *name_, std::size_t args_, double (*func_)(std::vector<double>)) : op(op_), name(name_), args(args_), func(func_) { }
	};

	static const rpn_eval_func rpn_eval_funcs[] = {
		rpn_eval_func('+', "add",   2, rpn_eval_add),
		rpn_eval_func('-', "sub",   2, rpn_eval_sub),
		rpn_eval_func('*', "mul",   2, rpn_eval_mul),
		rpn_eval_func('/', "div",   2, rpn_eval_div),
		rpn_eval_func('%', "mod",   2, rpn_eval_mod),
		rpn_eval_func('&', "bitand",2, rpn_eval_bitand),
		rpn_eval_func('|', "bitor", 2, rpn_eval_bitor),
		rpn_eval_func('^', "bitxor",2, rpn_eval_bitxor),
		rpn_eval_func('~', "bitnot",1, rpn_eval_bitnot),
		rpn_eval_func(op_and,"and", 2, rpn_eval_and),
		rpn_eval_func(op_or,"or",   2, rpn_eval_or),
		rpn_eval_func('!', "not",   1, rpn_eval_not),
		rpn_eval_func(op_neg,"neg", 1, rpn_eval_neg),
		rpn_eval_func(' ', "pow",   2, rpn_eval_pow),
		rpn_eval_func(' ', "sqrt",  1, rpn_eval_sqrt),
		rpn_eval_func(' ', "log",   1, rpn_eval_log),
		rpn_eval_func(' ', "exp",   1, rpn_eval_exp),
		rpn_eval_func(' ', "ln",    1, rpn_eval_ln),
		rpn_eval_func(' ', "sin",   1, rpn_eval_sin),
		rpn_eval_func(' ', "cos",   1, rpn_eval_cos),
		rpn_eval_func(' ', "tan",   1, rpn_eval_tan),
		rpn_eval_func(' ', "rand",  2, rpn_eval_rand),
		rpn_eval_func(' ', "min",   2, rpn_eval_min),
		rpn_eval_func(' ', "max",   2, rpn_eval_max),
		rpn_eval_func(' ', "ceil",  1, rpn_eval_ceil),
		rpn_eval_func(' ', "round", 1, rpn_eval_round),
		rpn_eval_func(' ', "floor", 1, rpn_eval_floor),
		rpn_eval_func('<', "lt",    2, rpn_eval_lt),
		rpn_eval_func(op_lte,"lte", 2, rpn_eval_lte),
		rpn_eval_func('=', "eq",    2, rpn_eval_eq),
		rpn_eval_func(op_ne,"ne",   2, rpn_eval_ne),
		rpn_eval_func(op_gte,"gte", 2, rpn_eval_gte),
		rpn_eval_func('>', "gt",    2, rpn_eval_gt),

		rpn_eval_func('?', "iif",   3, rpn_eval_iif),
	};

	std::stack<double> argstack;

	while (!stack.empty())
	{
		start_of_loop:

		const std::string& val = stack.top();
		stack.pop();

		for (std::size_t i = 0; i < sizeof(rpn_eval_funcs) / sizeof(rpn_eval_func); ++i)
		{
			const rpn_eval_func &func = rpn_eval_funcs[i];

			if (val == func.name || (func.op != ' ' && val[0] == func.op))
			{
				std::vector<double> args(func.args);

				for (std::size_t ii = 0; ii < func.args; ++ii)
				{
					if (argstack.empty())
					{
						throw std::runtime_error("RPN Stack underflow");
					}

					args[ii] = argstack.top();
					argstack.pop();
				}

				argstack.push(func.func(args));

				if (stack.empty())
					return argstack.top();

				goto start_of_loop;
			}
		}

		auto findvar = vars.find(val);

		if (findvar != vars.end())
		{
			argstack.push(findvar->second);
		}
		else
		{
			argstack.push(util::tdparse(val));
		}
	}

	if (argstack.empty())
		return 0.0;

	return argstack.top();
}